

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O0

char * xe::getImageCompressionName(Compression compression)

{
  char *pcStack_10;
  Compression compression_local;
  
  if (compression == COMPRESSION_NONE) {
    pcStack_10 = "None";
  }
  else if (compression == COMPRESSION_PNG) {
    pcStack_10 = "PNG";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getImageCompressionName (ri::Image::Compression compression)
{
	switch (compression)
	{
		case ri::Image::COMPRESSION_NONE:	return "None";
		case ri::Image::COMPRESSION_PNG:	return "PNG";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}